

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

VariableDeclStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariableDeclStatement,slang::ast::VariableSymbol_const&,slang::SourceRange&>
          (BumpAllocator *this,VariableSymbol *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  VariableDeclStatement *pVVar3;
  
  pVVar3 = (VariableDeclStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariableDeclStatement *)this->endPtr < pVVar3 + 1) {
    pVVar3 = (VariableDeclStatement *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pVVar3 + 1);
  }
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pVVar3->super_Statement).kind = VariableDeclaration;
  (pVVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pVVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pVVar3->super_Statement).sourceRange.endLoc = SVar2;
  pVVar3->symbol = args;
  return pVVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }